

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_MLS(DisasContext_conflict1 *s,arg_rprrr_esz *a)

{
  _Bool _Var1;
  
  _Var1 = do_zpzzz_ool(s,a,trans_MLS::fns[a->esz]);
  return _Var1;
}

Assistant:

static bool trans_MLS(DisasContext *s, arg_MLS *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    tcg_gen_mul_i32(tcg_ctx, t1, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t2);
    t2 = load_reg(s, a->ra);
    tcg_gen_sub_i32(tcg_ctx, t1, t2, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}